

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall
capnp::_::PipelineBuilderHook::PipelineBuilderHook(PipelineBuilderHook *this,uint firstSegmentWords)

{
  uint firstSegmentWords_local;
  PipelineBuilderHook *this_local;
  
  PipelineHook::PipelineHook(&this->super_PipelineHook);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&PTR_addRef_00d8aed0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00d8af08;
  MallocMessageBuilder::MallocMessageBuilder(&this->message,firstSegmentWords,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::AnyPointer>(&this->root,&(this->message).super_MessageBuilder);
  return;
}

Assistant:

PipelineBuilderHook(uint firstSegmentWords)
      : message(firstSegmentWords),
        root(message.getRoot<AnyPointer>()) {}